

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O1

int Psr_ManReadDeclaration(Psr_Man_t *p,int Type)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  byte *pbVar5;
  long lVar6;
  ulong uVar8;
  byte *pbVar9;
  undefined4 uVar10;
  Vec_Int_t *vNamesR [4];
  Vec_Int_t *vNames [4];
  long lVar7;
  
  if (Type < 1) {
    __assert_fail("Type >= PRS_VER_INPUT && Type <= PRS_VER_WIRE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadVer.c"
                  ,0x1ff,"int Psr_ManReadDeclaration(Psr_Man_t *, int)");
  }
  pbVar9 = (byte *)p->pLimit;
  pbVar5 = (byte *)p->pCur;
joined_r0x0039a2d6:
  if (pbVar9 <= pbVar5) {
LAB_0039a388:
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
      if (p->ErrorStr[0] == '\0') {
        uVar10._0_1_ = ' ';
        uVar10._1_1_ = '2';
        uVar10._2_1_ = '0';
        uVar10._3_1_ = '.';
LAB_0039a3d2:
        p->ErrorStr[0] = 'E';
        p->ErrorStr[1] = 'r';
        p->ErrorStr[2] = 'r';
        p->ErrorStr[3] = 'o';
        p->ErrorStr[4] = 'r';
        p->ErrorStr[5] = ' ';
        p->ErrorStr[6] = 'n';
        p->ErrorStr[7] = 'u';
        p->ErrorStr[8] = 'm';
        p->ErrorStr[9] = 'b';
        p->ErrorStr[10] = 'e';
        p->ErrorStr[0xb] = 'r';
        *(undefined4 *)(p->ErrorStr + 0xc) = uVar10;
        p->ErrorStr[0x10] = '\0';
        return 0;
      }
    }
LAB_0039a7d7:
    __assert_fail("!p->ErrorStr[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrs.h"
                  ,0x9d,"int Psr_ManErrorSet(Psr_Man_t *, char *, int)");
  }
  while( true ) {
    uVar8 = (ulong)*pbVar5;
    if (0x2f < uVar8) goto LAB_0039a3de;
    if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
  }
  if (uVar8 == 0x2f) {
    if (pbVar5[1] != 0x2a) {
      if (pbVar5[1] == 0x2f) {
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar5 < pbVar9) {
          while (*pbVar5 != 10) {
            pbVar5 = pbVar5 + 1;
            p->pCur = (char *)pbVar5;
            if (pbVar5 == pbVar9) goto LAB_0039a3de;
          }
          pbVar5 = pbVar5 + 1;
          goto LAB_0039a374;
        }
      }
      goto LAB_0039a3de;
    }
    pbVar5 = pbVar5 + 2;
    p->pCur = (char *)pbVar5;
    if (pbVar9 <= pbVar5) goto LAB_0039a3de;
    while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
      if (pbVar5 == pbVar9) goto LAB_0039a3de;
    }
    pbVar5 = pbVar5 + 2;
LAB_0039a374:
    p->pCur = (char *)pbVar5;
    goto joined_r0x0039a2d6;
  }
  if (uVar8 == 0) goto LAB_0039a388;
LAB_0039a3de:
  if ((*p->pCur == '[') && (iVar4 = Psr_ManReadRange(p), iVar4 == 0)) {
    if (p->ErrorStr[0] != '\0') goto LAB_0039a7d7;
    uVar10._0_1_ = ' ';
    uVar10._1_1_ = '2';
    uVar10._2_1_ = '1';
    uVar10._3_1_ = '.';
    goto LAB_0039a3d2;
  }
  (p->vTemp).nSize = 0;
  pcVar1 = p->ErrorStr;
  pbVar9 = (byte *)p->pCur;
  bVar2 = *pbVar9;
  if (bVar2 == 0x5c) {
    pbVar9 = pbVar9 + 1;
    pbVar5 = pbVar9;
    do {
      p->pCur = (char *)pbVar5;
      bVar2 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar2 != 0x20);
  }
  else {
    if ((bVar2 != 0x5f) && (iVar4 = 0, (byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) goto LAB_0039a48f;
    pbVar5 = pbVar9 + 1;
    do {
      do {
        p->pCur = (char *)pbVar5;
        bVar2 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (0xf5 < (byte)(bVar2 - 0x3a));
    } while (((bVar2 == 0x24) || (bVar2 == 0x5f)) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)));
  }
  iVar4 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar9,p->pCur,(int *)0x0);
LAB_0039a48f:
  if (iVar4 == 0) {
    if (*pcVar1 != '\0') goto LAB_0039a7d7;
    builtin_strncpy(pcVar1,"Cannot read name in the list.",0x1e);
  }
  else {
    pbVar9 = (byte *)p->pLimit;
    pbVar5 = (byte *)p->pCur;
    while (pbVar5 < pbVar9) {
      while( true ) {
        uVar8 = (ulong)*pbVar5;
        if (0x2f < uVar8) goto LAB_0039a5c3;
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar8 != 0x2f) {
        if (uVar8 == 0) break;
LAB_0039a5c3:
        lVar7 = 2;
        if (iVar4 == 4) goto LAB_0039a716;
        Vec_IntPush(&p->vTemp,iVar4);
        cVar3 = *p->pCur;
        if (cVar3 == ',') {
          pbVar5 = (byte *)(p->pCur + 1);
          p->pCur = (char *)pbVar5;
          pbVar9 = (byte *)p->pLimit;
          goto LAB_0039a62d;
        }
        lVar7 = 3;
        if (cVar3 == ';') goto LAB_0039a716;
        if (*pcVar1 != '\0') goto LAB_0039a7d7;
        builtin_strncpy(pcVar1,"Expecting comma in the list.",0x1d);
        goto LAB_0039a722;
      }
      if (pbVar5[1] != 0x2a) {
        if (pbVar5[1] == 0x2f) {
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar5 < pbVar9) {
            while (*pbVar5 != 10) {
              pbVar5 = pbVar5 + 1;
              p->pCur = (char *)pbVar5;
              if (pbVar5 == pbVar9) goto LAB_0039a5c3;
            }
            pbVar5 = pbVar5 + 1;
            goto LAB_0039a53d;
          }
        }
        goto LAB_0039a5c3;
      }
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar9 <= pbVar5) goto LAB_0039a5c3;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar9) goto LAB_0039a5c3;
      }
      pbVar5 = pbVar5 + 2;
LAB_0039a53d:
      p->pCur = (char *)pbVar5;
    }
    if (*pcVar1 != '\0') goto LAB_0039a7d7;
    builtin_strncpy(pcVar1,"Unexpectedly reached end-of-file.",0x22);
    if (*pcVar1 != '\0') goto LAB_0039a7d7;
    builtin_strncpy(pcVar1,"Error number 1.",0x10);
  }
LAB_0039a722:
  if (*pcVar1 == '\0') {
    builtin_strncpy(pcVar1,"Error number 22.",0x11);
    return 0;
  }
  goto LAB_0039a7d7;
LAB_0039a62d:
  if (pbVar9 <= pbVar5) {
LAB_0039a6d0:
    if (*pcVar1 == '\0') {
      builtin_strncpy(pcVar1,"Unexpectedly reached end-of-file.",0x22);
      if (*pcVar1 == '\0') {
        builtin_strncpy(pcVar1,"Error number 2.",0x10);
        lVar7 = 1;
LAB_0039a716:
        iVar4 = (*(code *)((long)&DAT_0096e3e0 + (long)(int)(&DAT_0096e3e0)[lVar7]))();
        return iVar4;
      }
    }
    goto LAB_0039a7d7;
  }
  while( true ) {
    uVar8 = (ulong)*pbVar5;
    lVar7 = 0;
    lVar6 = 0;
    if (0x2f < uVar8) goto LAB_0039a716;
    if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
  }
  if (uVar8 != 0x2f) {
    lVar7 = lVar6;
    if (uVar8 != 0) goto LAB_0039a716;
    goto LAB_0039a6d0;
  }
  if (pbVar5[1] == 0x2a) {
    pbVar5 = pbVar5 + 2;
    p->pCur = (char *)pbVar5;
    lVar7 = lVar6;
    if (pbVar9 <= pbVar5) goto LAB_0039a716;
    while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
      if (pbVar5 == pbVar9) goto LAB_0039a716;
    }
    pbVar5 = pbVar5 + 2;
  }
  else {
    if (pbVar5[1] != 0x2f) goto LAB_0039a716;
    pbVar5 = pbVar5 + 2;
    p->pCur = (char *)pbVar5;
    if (pbVar9 <= pbVar5) goto LAB_0039a716;
    while (*pbVar5 != 10) {
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
      lVar7 = lVar6;
      if (pbVar5 == pbVar9) goto LAB_0039a716;
    }
    pbVar5 = pbVar5 + 1;
  }
  p->pCur = (char *)pbVar5;
  goto LAB_0039a62d;
}

Assistant:

static inline int Psr_ManReadDeclaration( Psr_Man_t * p, int Type )
{
    int i, NameId, RangeId = 0;
    Vec_Int_t * vNames[4]  = { &p->pNtk->vInputs,  &p->pNtk->vOutputs,  &p->pNtk->vInouts,  &p->pNtk->vWires };
    Vec_Int_t * vNamesR[4] = { &p->pNtk->vInputsR, &p->pNtk->vOutputsR, &p->pNtk->vInoutsR, &p->pNtk->vWiresR };
    assert( Type >= PRS_VER_INPUT && Type <= PRS_VER_WIRE );
    if ( Psr_ManUtilSkipSpaces(p) )                                   return Psr_ManErrorSet(p, "Error number 20.", 0);
    if ( Psr_ManIsChar(p, '[') && !(RangeId = Psr_ManReadRange(p)) )  return Psr_ManErrorSet(p, "Error number 21.", 0);
    if ( !Psr_ManReadNameList( p, &p->vTemp, ';' ) )                  return Psr_ManErrorSet(p, "Error number 22.", 0);
    Vec_IntForEachEntry( &p->vTemp, NameId, i )
    {
        Vec_IntPush( vNames[Type - PRS_VER_INPUT], NameId );
        Vec_IntPush( vNamesR[Type - PRS_VER_INPUT], RangeId );
        if ( Type < PRS_VER_WIRE )
            Vec_IntPush( &p->pNtk->vOrder, Abc_Var2Lit2(NameId, Type) );
    }
    return 1;
}